

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minion.c
# Opt level: O0

int lminion(void)

{
  int iVar1;
  permonst *ptr_00;
  permonst *ptr;
  int tryct;
  
  ptr._0_4_ = 0;
  while( true ) {
    if (0x13 < (int)ptr) {
      return -1;
    }
    ptr_00 = mkclass(&u.uz,'\x1b',0);
    if ((ptr_00 != (permonst *)0x0) && ((ptr_00->mflags2 & 0x800) == 0)) break;
    ptr._0_4_ = (int)ptr + 1;
  }
  iVar1 = monsndx(ptr_00);
  return iVar1;
}

Assistant:

int lminion(void)
{
	int tryct;
	const struct permonst *ptr;

	for (tryct = 0; tryct < 20; tryct++) {
	    ptr = mkclass(&u.uz, S_ANGEL,0);
	    if (ptr && !is_lord(ptr))
		return monsndx(ptr);
	}

	return NON_PM;
}